

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_reservoir_sample.cpp
# Opt level: O1

void __thiscall
duckdb::BaseReservoirSampling::ReplaceElementWithIndex
          (BaseReservoirSampling *this,idx_t entry_index,double with_weight,bool pop)

{
  undefined7 in_register_00000011;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  idx_t local_30;
  undefined1 local_28 [16];
  double local_10;
  
  local_30 = entry_index;
  if ((int)CONCAT71(in_register_00000011,pop) != 0) {
    local_28._8_4_ = in_XMM0_Dc;
    local_28._0_8_ = with_weight;
    local_28._12_4_ = in_XMM0_Dd;
    ::std::
    priority_queue<std::pair<double,_unsigned_long>,_std::vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>,_std::less<std::pair<double,_unsigned_long>_>_>
    ::pop(&this->reservoir_weights);
    with_weight = (double)local_28._0_8_;
  }
  local_10 = -with_weight;
  ::std::
  priority_queue<std::pair<double,unsigned_long>,std::vector<std::pair<double,unsigned_long>,std::allocator<std::pair<double,unsigned_long>>>,std::less<std::pair<double,unsigned_long>>>
  ::emplace<double,unsigned_long&>
            ((priority_queue<std::pair<double,unsigned_long>,std::vector<std::pair<double,unsigned_long>,std::allocator<std::pair<double,unsigned_long>>>,std::less<std::pair<double,unsigned_long>>>
              *)&this->reservoir_weights,&local_10,&local_30);
  SetNextEntry(this);
  return;
}

Assistant:

void BaseReservoirSampling::ReplaceElementWithIndex(idx_t entry_index, double with_weight, bool pop) {

	if (pop) {
		reservoir_weights.pop();
	}
	double r2 = with_weight;
	//! now we insert the new weight into the reservoir
	reservoir_weights.emplace(-r2, entry_index);
	//! we update the min entry with the new min entry in the reservoir
	SetNextEntry();
}